

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidySortAttributes(TidyDocImpl *doc,Node *node,TidyAttrSortStrategy strat)

{
  tmbstr *pptVar1;
  int iVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  AttVal *pAVar5;
  AttVal *pAVar6;
  AttVal *pAVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  AttVal *pAVar11;
  int iVar12;
  code *pcVar13;
  bool bVar14;
  AttVal *local_58;
  
  if (node != (Node *)0x0) {
    do {
      pptVar1 = (doc->attribs).priorityAttribs.list;
      if (strat == TidySortAttrAlpha) {
        bVar14 = false;
        pcVar13 = AlphaComparator;
      }
      else if (((strat == TidySortAttrNone) && (pptVar1 != (tmbstr *)0x0)) &&
              (*pptVar1 != (tmbstr)0x0)) {
        bVar14 = false;
        pcVar13 = PriorityComparator;
      }
      else {
        bVar14 = true;
        pcVar13 = (code *)0x0;
      }
      local_58 = node->attributes;
      if (local_58 != (AttVal *)0x0 && !bVar14) {
        iVar9 = 1;
        pAVar11 = local_58;
        do {
          pAVar7 = (AttVal *)0x0;
          local_58 = (AttVal *)0x0;
          iVar12 = 0;
          do {
            iVar8 = iVar12;
            pAVar3 = pAVar11;
            iVar12 = 0;
            if (0 < iVar9) {
              iVar10 = 1;
              do {
                pAVar3 = pAVar3->next;
                if (pAVar3 == (AttVal *)0x0) {
                  pAVar3 = (AttVal *)0x0;
                  iVar12 = iVar10;
                  break;
                }
                bVar14 = iVar10 != iVar9;
                iVar10 = iVar10 + 1;
                iVar12 = iVar9;
              } while (bVar14);
            }
            pAVar4 = pAVar11;
            pAVar6 = pAVar7;
            pAVar11 = pAVar3;
            iVar10 = iVar9;
            pAVar3 = local_58;
            while ((local_58 = pAVar3, pAVar7 = pAVar6, 0 < iVar12 ||
                   ((0 < iVar10 && (pAVar11 != (AttVal *)0x0))))) {
              if (iVar12 == 0) {
                pAVar3 = pAVar11->next;
                iVar12 = 0;
LAB_001367af:
                iVar10 = iVar10 + -1;
                pAVar5 = pAVar4;
                pAVar6 = pAVar11;
              }
              else {
                if (((iVar10 != 0) && (pAVar11 != (AttVal *)0x0)) &&
                   (iVar2 = (*pcVar13)(pAVar4,pAVar11,pptVar1), 0 < iVar2)) {
                  pAVar3 = pAVar11->next;
                  goto LAB_001367af;
                }
                pAVar5 = pAVar4->next;
                iVar12 = iVar12 + -1;
                pAVar3 = pAVar11;
                pAVar6 = pAVar4;
              }
              pAVar4 = pAVar5;
              pAVar11 = pAVar3;
              pAVar3 = pAVar6;
              if (pAVar7 != (AttVal *)0x0) {
                pAVar7->next = pAVar6;
                pAVar3 = local_58;
              }
            }
            iVar12 = iVar8 + 1;
          } while (pAVar11 != (AttVal *)0x0);
          pAVar7->next = (AttVal *)0x0;
          iVar9 = iVar9 * 2;
          pAVar11 = local_58;
        } while (iVar8 != 0);
      }
      node->attributes = local_58;
      if (node->content != (Node *)0x0) {
        prvTidySortAttributes(doc,node->content,strat);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(SortAttributes)(TidyDocImpl* doc, Node* node, TidyAttrSortStrategy strat)
{
    while (node)
    {
        node->attributes = SortAttVal( doc, node->attributes, strat );
        if (node->content)
            TY_(SortAttributes)(doc, node->content, strat);
        node = node->next;
    }
}